

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

size_t __thiscall google::protobuf::MessageOptions::ByteSizeLong(MessageOptions *this)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  type_conflict tVar4;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *this_00;
  reference value;
  uint32_t *puVar5;
  size_t sVar6;
  UninterpretedOption *msg;
  const_iterator __end3;
  const_iterator __begin3;
  RepeatedPtrField<google::protobuf::UninterpretedOption> *__range3;
  size_t sStack_58;
  uint32_t cached_has_bits;
  size_t total_size;
  MessageOptions *this_;
  MessageOptions *this_local;
  ulong local_38;
  size_t line;
  void *prefetch_ptr;
  ptrdiff_t offset;
  
  sStack_58 = internal::ExtensionSet::ByteSize(&(this->field_0)._impl_._extensions_);
  for (local_38 = 0; local_38 < 5; local_38 = local_38 + 1) {
  }
  iVar3 = _internal_uninterpreted_option_size(this);
  sStack_58 = (long)iVar3 * 2 + sStack_58;
  this_00 = _internal_uninterpreted_option(this);
  __end3 = RepeatedPtrField<google::protobuf::UninterpretedOption>::begin(this_00);
  msg = (UninterpretedOption *)RepeatedPtrField<google::protobuf::UninterpretedOption>::end(this_00)
  ;
  while( true ) {
    bVar2 = internal::operator!=(&__end3,(iterator *)&msg);
    if (!bVar2) break;
    value = internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator*
                      (&__end3);
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::UninterpretedOption>(value);
    sStack_58 = sVar6 + sStack_58;
    internal::RepeatedPtrIterator<const_google::protobuf::UninterpretedOption>::operator++(&__end3);
  }
  puVar5 = internal::HasBits<1>::operator[](&(this->field_0)._impl_._has_bits_,0);
  uVar1 = *puVar5;
  tVar4 = absl::lts_20250127::popcount<unsigned_int>(uVar1 & 0x3e);
  sStack_58 = (long)(tVar4 << 1) + sStack_58;
  if ((uVar1 & 1) != 0) {
    sVar6 = internal::WireFormatLite::MessageSize<google::protobuf::FeatureSet>
                      ((this->field_0)._impl_.features_);
    sStack_58 = sVar6 + 1 + sStack_58;
  }
  sVar6 = Message::MaybeComputeUnknownFieldsSize
                    (&this->super_Message,sStack_58,&(this->field_0)._impl_._cached_size_);
  return sVar6;
}

Assistant:

::size_t MessageOptions::ByteSizeLong() const {
  const MessageOptions& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:google.protobuf.MessageOptions)
  ::size_t total_size = 0;
  total_size += this_._impl_._extensions_.ByteSize();

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
    {
      total_size += 2UL * this_._internal_uninterpreted_option_size();
      for (const auto& msg : this_._internal_uninterpreted_option()) {
        total_size += ::google::protobuf::internal::WireFormatLite::MessageSize(msg);
      }
    }
  }
  cached_has_bits = this_._impl_._has_bits_[0];
  total_size += ::absl::popcount(0x0000003eu & cached_has_bits) * 2;
   {
    // optional .google.protobuf.FeatureSet features = 12;
    if ((cached_has_bits & 0x00000001u) != 0) {
      total_size += 1 +
                    ::google::protobuf::internal::WireFormatLite::MessageSize(*this_._impl_.features_);
    }
  }
  return this_.MaybeComputeUnknownFieldsSize(total_size,
                                             &this_._impl_._cached_size_);
}